

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::batch_normalize_conv_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  undefined8 uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar10;
  tensor *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  long *in_RDI;
  tensor *in_R8;
  tensor *in_R9;
  double in_XMM0_Qa;
  double dVar11;
  long j;
  float invstd;
  long k;
  long n;
  long num;
  float *v;
  float *m;
  float *b;
  float *g;
  float *s;
  float *d;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffb80;
  tensor *in_stack_fffffffffffffb88;
  resizable_tensor *in_stack_fffffffffffffb90;
  long local_240;
  long local_230;
  long local_228;
  float *local_1f8;
  float *local_1f0;
  ostream local_1b0;
  tensor *local_38;
  tensor *local_30;
  tensor *local_28;
  tensor *local_20;
  tensor *local_18;
  long *local_10;
  double local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_XMM0_Qa;
  lVar6 = tensor::num_samples(in_RDX);
  if (((lVar6 == 1) && (lVar6 = tensor::nr(local_20), lVar6 == 1)) &&
     (lVar6 = tensor::nc(local_20), lVar6 == 1)) {
    lVar6 = tensor::k(local_20);
    lVar7 = tensor::k(local_18);
    if (((lVar6 == lVar7) &&
        (bVar1 = have_same_dimensions
                           (&in_stack_fffffffffffffb90->super_tensor,in_stack_fffffffffffffb88),
        bVar1)) &&
       ((bVar1 = have_same_dimensions
                           (&in_stack_fffffffffffffb90->super_tensor,in_stack_fffffffffffffb88),
        bVar1 && ((bVar1 = have_same_dimensions
                                     (&in_stack_fffffffffffffb90->super_tensor,
                                      in_stack_fffffffffffffb88), bVar1 && (0.0 < local_8)))))) {
      resizable_tensor::copy_size(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      local_1f0 = (float *)(**(code **)(*local_10 + 0x18))();
      iVar2 = (*local_18->_vptr_tensor[2])();
      local_1f8 = (float *)CONCAT44(extraout_var,iVar2);
      iVar2 = (*local_20->_vptr_tensor[2])();
      iVar3 = (*local_28->_vptr_tensor[2])();
      iVar4 = (*local_30->_vptr_tensor[2])();
      iVar5 = (*local_38->_vptr_tensor[2])();
      lVar6 = tensor::nr(local_18);
      lVar7 = tensor::nc(local_18);
      for (local_228 = 0; lVar10 = tensor::num_samples(local_18), local_228 < lVar10;
          local_228 = local_228 + 1) {
        for (local_230 = 0; lVar10 = tensor::k(local_18), local_230 < lVar10;
            local_230 = local_230 + 1) {
          dVar11 = sqrt((double)*(float *)(CONCAT44(extraout_var_03,iVar5) + local_230 * 4) +
                        local_8);
          for (local_240 = 0; local_240 < lVar6 * lVar7; local_240 = local_240 + 1) {
            *local_1f0 = *(float *)(CONCAT44(extraout_var_00,iVar2) + local_230 * 4) *
                         (*local_1f8 - *(float *)(CONCAT44(extraout_var_02,iVar4) + local_230 * 4))
                         * (float)(1.0 / dVar11) +
                         *(float *)(CONCAT44(extraout_var_01,iVar3) + local_230 * 4);
            local_1f0 = local_1f0 + 1;
            local_1f8 = local_1f8 + 1;
          }
        }
      }
      return;
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  poVar8 = std::operator<<(&local_1b0,"\n\nError detected at line ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x3b3);
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<(&local_1b0,"Error detected in file ");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<(&local_1b0,"Error detected in function ");
  poVar8 = std::operator<<(poVar8,
                           "void dlib::cpu::batch_normalize_conv_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar8,".\n\n");
  poVar8 = std::operator<<(&local_1b0,"Failing expression was ");
  poVar8 = std::operator<<(poVar8,
                           "gamma.num_samples() == 1 && gamma.nr() == 1 && gamma.nc() == 1 && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
                          );
  std::operator<<(poVar8,".\n");
  poVar8 = (ostream *)std::ostream::operator<<(&local_1b0,std::boolalpha);
  poVar8 = std::operator<<(poVar8,"\ngamma.num_samples(): ");
  lVar6 = tensor::num_samples(local_20);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\ngamma.k():  ");
  lVar6 = tensor::k(local_20);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\ngamma.nr(): ");
  lVar6 = tensor::nr(local_20);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\ngamma.nc(): ");
  lVar6 = tensor::nc(local_20);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nbeta.num_samples(): ");
  lVar6 = tensor::num_samples(local_28);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nbeta.k():   ");
  lVar6 = tensor::k(local_28);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nbeta.nr():  ");
  lVar6 = tensor::nr(local_28);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nbeta.nc():  ");
  lVar6 = tensor::nc(local_28);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_means.num_samples(): ");
  lVar6 = tensor::num_samples(local_30);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_means.k():   ");
  lVar6 = tensor::k(local_30);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_means.nr():  ");
  lVar6 = tensor::nr(local_30);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_means.nc():  ");
  lVar6 = tensor::nc(local_30);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_variances.num_samples(): ");
  lVar6 = tensor::num_samples(local_38);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_variances.k():   ");
  lVar6 = tensor::k(local_38);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_variances.nr():  ");
  lVar6 = tensor::nr(local_38);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nrunning_variances.nc():  ");
  lVar6 = tensor::nc(local_38);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nsrc.k():   ");
  lVar6 = tensor::k(local_18);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nsrc.nr():  ");
  lVar6 = tensor::nr(local_18);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\nsrc.nc():  ");
  lVar6 = tensor::nc(local_18);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,lVar6);
  poVar8 = std::operator<<(poVar8,"\neps:  ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_8);
  std::operator<<(poVar8,"\n");
  uVar9 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error
            ((fatal_error *)poVar8,(error_type)((ulong)uVar9 >> 0x20),in_stack_fffffffffffffb80);
  __cxa_throw(uVar9,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void batch_normalize_conv_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == 1 &&
                gamma.nc() == 1 &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    const float invstd = 1.0f/std::sqrt(v[k] + eps);
                    for (long j = 0; j < num; ++j)
                    {
                        *d = g[k]*(*s - m[k])*invstd + b[k];
                        ++d;
                        ++s;
                    }
                }
            }
        }